

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMU_SENSITIVE_COMPOSITE_Unmarshal
                 (TPMU_SENSITIVE_COMPOSITE *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  int iVar1;
  BYTE *pBVar2;
  UINT16 UVar3;
  TPM_RC TVar4;
  uint uVar5;
  
  if ((int)selector < 0x23) {
    if (selector == 1) {
      iVar1 = *size;
      *size = iVar1 + -2;
      TVar4 = 0x9a;
      if (1 < iVar1) {
        UVar3 = ByteArrayToUint16(*buffer);
        *(UINT16 *)target = UVar3;
        pBVar2 = *buffer;
        *buffer = pBVar2 + 2;
        TVar4 = 0x95;
        if (*(ushort *)target < 0x81) {
          TVar4 = 0x9a;
          uVar5 = (uint)*(ushort *)target;
          if ((int)uVar5 <= *size) {
            memcpy((void *)((long)target + 2),pBVar2 + 2,(ulong)uVar5);
            *size = *size - uVar5;
            *buffer = *buffer + uVar5;
            TVar4 = 0;
          }
        }
      }
      return TVar4;
    }
    if (selector == 8) {
      iVar1 = *size;
      *size = iVar1 + -2;
      TVar4 = 0x9a;
      if (1 < iVar1) {
        UVar3 = ByteArrayToUint16(*buffer);
        *(UINT16 *)target = UVar3;
        pBVar2 = *buffer;
        *buffer = pBVar2 + 2;
        TVar4 = 0x95;
        if (*(ushort *)target < 0x85) {
          TVar4 = 0x9a;
          uVar5 = (uint)*(ushort *)target;
          if ((int)uVar5 <= *size) {
            memcpy((void *)((long)target + 2),pBVar2 + 2,(ulong)uVar5);
            *size = *size - uVar5;
            *buffer = *buffer + uVar5;
            TVar4 = 0;
          }
        }
      }
      return TVar4;
    }
  }
  else {
    if (selector == 0x23) {
      iVar1 = *size;
      *size = iVar1 + -2;
      TVar4 = 0x9a;
      if (1 < iVar1) {
        UVar3 = ByteArrayToUint16(*buffer);
        *(UINT16 *)target = UVar3;
        pBVar2 = *buffer;
        *buffer = pBVar2 + 2;
        TVar4 = 0x95;
        if (*(ushort *)target < 0x21) {
          TVar4 = 0x9a;
          uVar5 = (uint)*(ushort *)target;
          if ((int)uVar5 <= *size) {
            memcpy((void *)((long)target + 2),pBVar2 + 2,(ulong)uVar5);
            *size = *size - uVar5;
            *buffer = *buffer + uVar5;
            TVar4 = 0;
          }
        }
      }
      return TVar4;
    }
    if (selector == 0x25) {
      iVar1 = *size;
      *size = iVar1 + -2;
      TVar4 = 0x9a;
      if (1 < iVar1) {
        UVar3 = ByteArrayToUint16(*buffer);
        *(UINT16 *)target = UVar3;
        pBVar2 = *buffer;
        *buffer = pBVar2 + 2;
        TVar4 = 0x95;
        if (*(ushort *)target < 0x21) {
          TVar4 = 0x9a;
          uVar5 = (uint)*(ushort *)target;
          if ((int)uVar5 <= *size) {
            memcpy((void *)((long)target + 2),pBVar2 + 2,(ulong)uVar5);
            *size = *size - uVar5;
            *buffer = *buffer + uVar5;
            TVar4 = 0;
          }
        }
      }
      return TVar4;
    }
  }
  return 0x98;
}

Assistant:

TPM_RC
TPMU_SENSITIVE_COMPOSITE_Unmarshal(TPMU_SENSITIVE_COMPOSITE *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPM2B_PRIVATE_KEY_RSA_Unmarshal((TPM2B_PRIVATE_KEY_RSA *)&(target->rsa), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPM2B_ECC_PARAMETER_Unmarshal((TPM2B_ECC_PARAMETER *)&(target->ecc), buffer, size);
#endif // ALG_ECC
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPM2B_SENSITIVE_DATA_Unmarshal((TPM2B_SENSITIVE_DATA *)&(target->bits), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPM2B_SYM_KEY_Unmarshal((TPM2B_SYM_KEY *)&(target->sym), buffer, size);
#endif // ALG_SYMCIPHER
    }
    return TPM_RC_SELECTOR;
}